

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O3

FARPROC GetProcAddress(HMODULE hModule,LPCSTR lpProcName)

{
  undefined8 uVar1;
  long lVar2;
  BOOL BVar3;
  errno_t eVar4;
  FARPROC ProcAddress;
  char *lpMultiByteStr;
  LPWSTR pWVar5;
  size_t sVar6;
  long *_Dst;
  DWORD dwErrCode;
  size_t _SizeInBytes;
  long in_FS_OFFSET;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  _Dst = &local_38;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_0012c3a0;
  uStack_40 = 0x12c1d6;
  LockModuleList();
  if ((lpProcName == (LPCSTR)0x0) || (*lpProcName == '\0')) {
    _Dst = &local_38;
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012c3a0;
    dwErrCode = 0x57;
    _Dst = &local_38;
LAB_0012c2cb:
    *(char *)((long)_Dst + -8) = -0x30;
    *(char *)((long)_Dst + -7) = -0x3e;
    *(char *)((long)_Dst + -6) = '\x12';
    *(char *)((long)_Dst + -5) = '\0';
    *(char *)((long)_Dst + -4) = '\0';
    *(char *)((long)_Dst + -3) = '\0';
    *(char *)((long)_Dst + -2) = '\0';
    *(char *)((long)_Dst + -1) = '\0';
    SetLastError(dwErrCode);
    ProcAddress = (FARPROC)0x0;
  }
  else {
    uStack_40 = 0x12c1f1;
    BVar3 = LOADValidateModule((MODSTRUCT *)hModule);
    if (BVar3 == 0) {
      _Dst = &local_38;
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012c3a0;
      dwErrCode = 6;
      _Dst = &local_38;
      goto LAB_0012c2cb;
    }
    if (lpProcName < (LPCSTR)0x1000) {
      uStack_40 = 0x12c22e;
      fprintf(_stderr,"] %s %s:%d","GetProcAddress",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/loader/module.cpp"
              ,0x136);
      uStack_40 = 0x12c23f;
      fprintf(_stderr,"Attempt to locate symbol by ordinal?!\n");
    }
    _Dst = &local_38;
    if ((pal_module != (MODSTRUCT *)0x0) &&
       (_Dst = &local_38, *(void **)((long)hModule + 8) == pal_module->dl_handle)) {
      uStack_40 = 0x12c335;
      sVar6 = strlen(lpProcName);
      _SizeInBytes = (size_t)((int)sVar6 + 5);
      lVar2 = -(_SizeInBytes + 0xf & 0xfffffffffffffff0);
      _Dst = (long *)((long)&local_38 + lVar2);
      *(undefined8 *)((long)&uStack_40 + lVar2) = 0x12c35f;
      eVar4 = strcpy_s((char *)_Dst,_SizeInBytes,"PAL_");
      if (eVar4 == 0) {
        *(undefined8 *)((long)&uStack_40 + lVar2) = 0x12c371;
        eVar4 = strcat_s((char *)_Dst,_SizeInBytes,lpProcName);
        if (eVar4 == 0) {
          uVar1 = *(undefined8 *)((long)hModule + 8);
          *(undefined8 *)((long)&uStack_40 + lVar2) = 0x12c392;
          ProcAddress = (FARPROC)dlsym(uVar1,_Dst);
          if (ProcAddress == (FARPROC)0x0) goto LAB_0012c25c;
          goto LAB_0012c271;
        }
      }
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012c3a0;
      dwErrCode = 0x7a;
      goto LAB_0012c2cb;
    }
LAB_0012c25c:
    uVar1 = *(undefined8 *)((long)hModule + 8);
    *(char *)((long)_Dst + -8) = 'h';
    *(char *)((long)_Dst + -7) = -0x3e;
    *(char *)((long)_Dst + -6) = '\x12';
    *(char *)((long)_Dst + -5) = '\0';
    *(char *)((long)_Dst + -4) = '\0';
    *(char *)((long)_Dst + -3) = '\0';
    *(char *)((long)_Dst + -2) = '\0';
    *(char *)((long)_Dst + -1) = '\0';
    ProcAddress = (FARPROC)dlsym(uVar1,lpProcName);
    if (ProcAddress == (FARPROC)0x0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012c3a0;
      *(char *)((long)_Dst + -8) = '&';
      *(char *)((long)_Dst + -7) = -0x3d;
      *(char *)((long)_Dst + -6) = '\x12';
      *(char *)((long)_Dst + -5) = '\0';
      *(char *)((long)_Dst + -4) = '\0';
      *(char *)((long)_Dst + -3) = '\0';
      *(char *)((long)_Dst + -2) = '\0';
      *(char *)((long)_Dst + -1) = '\0';
      dlerror();
      dwErrCode = 0x7f;
      goto LAB_0012c2cb;
    }
LAB_0012c271:
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012c3a0;
    if ((*(long *)((long)hModule + 0x18) == 0) && (*(long *)((long)hModule + 8) != 0)) {
      *(char *)((long)_Dst + -8) = -0x6b;
      *(char *)((long)_Dst + -7) = -0x3e;
      *(char *)((long)_Dst + -6) = '\x12';
      *(char *)((long)_Dst + -5) = '\0';
      *(char *)((long)_Dst + -4) = '\0';
      *(char *)((long)_Dst + -3) = '\0';
      *(char *)((long)_Dst + -2) = '\0';
      *(char *)((long)_Dst + -1) = '\0';
      lpMultiByteStr = PAL_dladdr(ProcAddress);
      if (lpMultiByteStr != (char *)0x0) {
        *(char *)((long)_Dst + -8) = -0x59;
        *(char *)((long)_Dst + -7) = -0x3e;
        *(char *)((long)_Dst + -6) = '\x12';
        *(char *)((long)_Dst + -5) = '\0';
        *(char *)((long)_Dst + -4) = '\0';
        *(char *)((long)_Dst + -3) = '\0';
        *(char *)((long)_Dst + -2) = '\0';
        *(char *)((long)_Dst + -1) = '\0';
        pWVar5 = UTIL_MBToWC_Alloc(lpMultiByteStr,-1);
        *(LPWSTR *)((long)hModule + 0x18) = pWVar5;
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012c3a0;
      }
    }
  }
  *(undefined8 *)((long)_Dst + -8) = 0x12c2d8;
  UnlockModuleList();
  if (PAL_InitializeChakraCoreCalled != false) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
      *(code **)((long)_Dst + -8) = LockModuleList;
      __stack_chk_fail();
    }
    return ProcAddress;
  }
LAB_0012c3a0:
  *(char *)((long)_Dst + -8) = -0x5b;
  *(char *)((long)_Dst + -7) = -0x3d;
  *(char *)((long)_Dst + -6) = '\x12';
  *(char *)((long)_Dst + -5) = '\0';
  *(char *)((long)_Dst + -4) = '\0';
  *(char *)((long)_Dst + -3) = '\0';
  *(char *)((long)_Dst + -2) = '\0';
  *(char *)((long)_Dst + -1) = '\0';
  abort();
}

Assistant:

FARPROC
PALAPI
GetProcAddress(
    IN HMODULE hModule,
    IN LPCSTR lpProcName)
{
    MODSTRUCT *module;
    FARPROC ProcAddress = nullptr;
    LPCSTR symbolName = lpProcName;

    PERF_ENTRY(GetProcAddress);
    ENTRY("GetProcAddress (hModule=%p, lpProcName=%p (%s))\n",
          hModule, lpProcName ? lpProcName : "NULL", lpProcName ? lpProcName : "NULL");

    LockModuleList();

    module = (MODSTRUCT *) hModule;

    /* parameter validation */

    if ((lpProcName == nullptr) || (*lpProcName == '\0'))
    {
        TRACE("No function name given\n");
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }

    if (!LOADValidateModule(module))
    {
        TRACE("Invalid module handle %p\n", hModule);
        SetLastError(ERROR_INVALID_HANDLE);
        goto done;
    }

    /* try to assert on attempt to locate symbol by ordinal */
    /* this can't be an exact test for HIWORD((DWORD)lpProcName) == 0
       because of the address range reserved for ordinals contain can
       be a valid string address on non-Windows systems
    */
    if ((DWORD_PTR)lpProcName < VIRTUAL_PAGE_SIZE)
    {
        ASSERT("Attempt to locate symbol by ordinal?!\n");
    }

    // Get the symbol's address.

    // If we're looking for a symbol inside the PAL, we try the PAL_ variant
    // first because otherwise we run the risk of having the non-PAL_
    // variant preferred over the PAL's implementation.
    if (pal_module && module->dl_handle == pal_module->dl_handle)
    {
        int iLen = 4 + strlen(lpProcName) + 1;
        LPSTR lpPALProcName = (LPSTR) alloca(iLen);

        if (strcpy_s(lpPALProcName, iLen, "PAL_") != SAFECRT_SUCCESS)
        {
            ERROR("strcpy_s failed!\n");
            SetLastError(ERROR_INSUFFICIENT_BUFFER);
            goto done;
        }

        if (strcat_s(lpPALProcName, iLen, lpProcName) != SAFECRT_SUCCESS)
        {
            ERROR("strcat_s failed!\n");
            SetLastError(ERROR_INSUFFICIENT_BUFFER);
            goto done;
        }

        ProcAddress = (FARPROC) dlsym(module->dl_handle, lpPALProcName);
        symbolName = lpPALProcName;
    }

    // If we aren't looking inside the PAL or we didn't find a PAL_ variant
    // inside the PAL, fall back to a normal search.
    if (ProcAddress == nullptr)
    {
        ProcAddress = (FARPROC) dlsym(module->dl_handle, lpProcName);
    }

    if (ProcAddress)
    {
        TRACE("Symbol %s found at address %p in module %p (named %S)\n",
              lpProcName, ProcAddress, module, MODNAME(module));

        /* if we don't know the module's full name yet, this is our chance to obtain it */
        if (!module->lib_name && module->dl_handle)
        {
            const char* libName = PAL_dladdr((LPVOID)ProcAddress);
            if (libName)
            {
                module->lib_name = UTIL_MBToWC_Alloc(libName, -1);
                if (nullptr == module->lib_name)
                {
                    ERROR("MBToWC failure; can't save module's full name\n");
                }
                else
                {
                    TRACE("Saving full path of module %p as %s\n",
                          module, libName);
                }
            }
        }
    }
    else
    {
        TRACE("Symbol %s not found in module %p (named %S), dlerror message is \"%s\"\n",
              lpProcName, module, MODNAME(module), dlerror());
        SetLastError(ERROR_PROC_NOT_FOUND);
    }
done:
    UnlockModuleList();
    LOGEXIT("GetProcAddress returns FARPROC %p\n", ProcAddress);
    PERF_EXIT(GetProcAddress);
    return ProcAddress;
}